

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O0

int BacManReadBacNameAndNums(char *pBuffer,int *Num1,int *Num2,int *Num3,int *Num4)

{
  int iVar1;
  bool bVar2;
  int *Num4_local;
  int *Num3_local;
  int *Num2_local;
  int *Num1_local;
  char *pBuffer_local;
  
  *Num4 = -1;
  *Num3 = -1;
  *Num2 = -1;
  *Num1 = -1;
  Num1_local = (int *)pBuffer;
  while( true ) {
    bVar2 = false;
    if ((char)*Num1_local != '\0') {
      bVar2 = (char)*Num1_local != ' ';
    }
    if (!bVar2) break;
    Num1_local = (int *)((long)Num1_local + 1);
  }
  if ((char)*Num1_local == '\0') {
    pBuffer_local._4_4_ = 0;
  }
  else {
    if ((char)*Num1_local != ' ') {
      __assert_fail("*pBuffer == \' \'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBac.c"
                    ,0x3d,"int BacManReadBacNameAndNums(char *, int *, int *, int *, int *)");
    }
    *(undefined1 *)Num1_local = 0;
    Num1_local = (int *)((long)Num1_local + 1);
    iVar1 = atoi((char *)Num1_local);
    *Num1 = iVar1;
    while( true ) {
      bVar2 = false;
      if ((char)*Num1_local != '\0') {
        bVar2 = (char)*Num1_local != ' ';
      }
      if (!bVar2) break;
      Num1_local = (int *)((long)Num1_local + 1);
    }
    if ((char)*Num1_local == '\0') {
      pBuffer_local._4_4_ = 0;
    }
    else {
      if ((char)*Num1_local != ' ') {
        __assert_fail("*pBuffer == \' \'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBac.c"
                      ,0x46,"int BacManReadBacNameAndNums(char *, int *, int *, int *, int *)");
      }
      Num1_local = (int *)((long)Num1_local + 1);
      iVar1 = atoi((char *)Num1_local);
      *Num2 = iVar1;
      while( true ) {
        bVar2 = false;
        if ((char)*Num1_local != '\0') {
          bVar2 = (char)*Num1_local != ' ';
        }
        if (!bVar2) break;
        Num1_local = (int *)((long)Num1_local + 1);
      }
      if ((char)*Num1_local == '\0') {
        pBuffer_local._4_4_ = 1;
      }
      else {
        if ((char)*Num1_local != ' ') {
          __assert_fail("*pBuffer == \' \'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBac.c"
                        ,0x4d,"int BacManReadBacNameAndNums(char *, int *, int *, int *, int *)");
        }
        Num1_local = (int *)((long)Num1_local + 1);
        iVar1 = atoi((char *)Num1_local);
        *Num3 = iVar1;
        while( true ) {
          bVar2 = false;
          if ((char)*Num1_local != '\0') {
            bVar2 = (char)*Num1_local != ' ';
          }
          if (!bVar2) break;
          Num1_local = (int *)((long)Num1_local + 1);
        }
        if ((char)*Num1_local == '\0') {
          pBuffer_local._4_4_ = 1;
        }
        else {
          if ((char)*Num1_local != ' ') {
            __assert_fail("*pBuffer == \' \'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBac.c"
                          ,0x54,"int BacManReadBacNameAndNums(char *, int *, int *, int *, int *)");
          }
          iVar1 = atoi((char *)((long)Num1_local + 1));
          *Num4 = iVar1;
          pBuffer_local._4_4_ = 1;
        }
      }
    }
  }
  return pBuffer_local._4_4_;
}

Assistant:

int BacManReadBacNameAndNums( char * pBuffer, int * Num1, int * Num2, int * Num3, int * Num4 )
{
    *Num1 = *Num2 = *Num3 = *Num4 = -1;
    // read name
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 0;
    assert( *pBuffer == ' ' );
    *pBuffer = 0;
    // read Num1
    *Num1 = atoi(++pBuffer);
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 0;
    // read Num2
    assert( *pBuffer == ' ' );
    *Num2 = atoi(++pBuffer);
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 1;
    // read Num3
    assert( *pBuffer == ' ' );
    *Num3 = atoi(++pBuffer);
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 1;
    // read Num4
    assert( *pBuffer == ' ' );
    *Num4 = atoi(++pBuffer);
    return 1;
}